

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cc
# Opt level: O0

Builder<prometheus::Info> * prometheus::BuildInfo(void)

{
  Builder<prometheus::Info> *in_RDI;
  
  memset(in_RDI,0,0x70);
  detail::Builder<prometheus::Info>::Builder(in_RDI);
  return in_RDI;
}

Assistant:

detail::Builder<Info> BuildInfo() { return {}; }